

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhsum.c
# Opt level: O3

void XSUM_benchHash(hashFunction h,char *hName,int testID,void *buffer,size_t bufferSize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  XSUM_U32 XVar3;
  clock_t cVar4;
  clock_t cVar5;
  int iVar6;
  uint uVar7;
  XSUM_U32 XVar8;
  ulong uVar9;
  XSUM_U32 XVar10;
  undefined4 uVar11;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_70;
  undefined1 auVar12 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = bufferSize + 1;
  uVar9 = (ulong)(SUB164((ZEXT416(0) << 0x40 | ZEXT816(0x12c00000)) / auVar1,0) + 1);
  uVar2 = g_nbIterations + (g_nbIterations == 0);
  XSUM_logVerbose(2,"\r%80s\r","");
  auVar12._8_4_ = (int)(bufferSize >> 0x20);
  auVar12._0_8_ = bufferSize;
  auVar12._12_4_ = 0x45300000;
  uVar11 = (undefined4)bufferSize;
  dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0)) * 9.5367431640625e-07;
  local_70 = 100000000.0;
  uVar7 = 1;
  do {
    XSUM_logVerbose(2,"%2u-%-*.*s : %10u ->\r",(ulong)uVar7,0x1d,0x1d,hName,uVar11);
    cVar4 = clock();
    do {
      cVar5 = clock();
    } while (cVar5 == cVar4);
    cVar4 = clock();
    XVar8 = (XSUM_U32)uVar9;
    if (XVar8 == 0) {
LAB_0010312d:
      XSUM_logVerbose(3,".\r");
    }
    else {
      XVar10 = 0;
      iVar6 = 0;
      do {
        XVar3 = (*h)(buffer,bufferSize,XVar10);
        iVar6 = iVar6 + XVar3;
        XVar10 = XVar10 + 1;
      } while (XVar8 != XVar10);
      if (iVar6 == 0) goto LAB_0010312d;
    }
    cVar5 = clock();
    dVar16 = ((double)(cVar5 - cVar4) / 1000000.0) / (double)(uVar9 & 0xffffffff);
    if (cVar5 - cVar4 < 500000) {
      if (cVar5 == cVar4) {
        uVar9 = (ulong)(XVar8 * 100);
      }
      else {
        dVar15 = 1.0 / dVar16 + 1.0;
        dVar14 = 4194304000.0;
        if (dVar15 <= 4194304000.0) {
          dVar14 = dVar15;
        }
        uVar9 = (ulong)dVar14;
      }
      if (g_nbIterations == 0) goto LAB_001031b7;
    }
    else {
LAB_001031b7:
      if (local_70 <= dVar16) {
        dVar16 = local_70;
      }
      if (0.0 < dVar16) {
        XSUM_logVerbose(2,"%2u-%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \r",1.0 / dVar16,
                        dVar13 / dVar16,(ulong)uVar7,0x1d,0x1d,hName,uVar11);
      }
      uVar7 = uVar7 + 1;
      dVar15 = 1.0 / dVar16 + 1.0;
      dVar14 = 4194304000.0;
      if (dVar15 <= 4194304000.0) {
        dVar14 = dVar15;
      }
      uVar9 = (ulong)dVar14;
      local_70 = dVar16;
    }
    if (uVar2 < uVar7) {
      XSUM_logVerbose(1,"%2i#%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \n",1.0 / local_70,
                      dVar13 / local_70,(ulong)(uint)testID,0x1d,0x1d,hName,uVar11);
      if (0 < XSUM_logLevel) {
        return;
      }
      XSUM_logVerbose(0,"%u, ",(long)(1.0 / local_70));
      return;
    }
  } while( true );
}

Assistant:

static void XSUM_benchHash(hashFunction h, const char* hName, int testID,
                          const void* buffer, size_t bufferSize)
{
    XSUM_U32 nbh_perIteration = (XSUM_U32)((300 MB) / (bufferSize+1)) + 1;  /* first iteration conservatively aims for 300 MB/s */
    unsigned iterationNb, nbIterations = g_nbIterations + !g_nbIterations /* min 1 */;
    double fastestH = 100000000.;
    assert(HASHNAME_MAX > 2);
    XSUM_logVerbose(2, "\r%80s\r", "");       /* Clean display line */

    for (iterationNb = 1; iterationNb <= nbIterations; iterationNb++) {
        XSUM_U32 r=0;
        clock_t cStart;

        XSUM_logVerbose(2, "%2u-%-*.*s : %10u ->\r",
                        iterationNb,
                        HASHNAME_MAX, HASHNAME_MAX, hName,
                        (unsigned)bufferSize);
        cStart = clock();
        while (clock() == cStart);   /* starts clock() at its exact beginning */
        cStart = clock();

        {   XSUM_U32 u;
            for (u=0; u<nbh_perIteration; u++)
                r += h(buffer, bufferSize, u);
        }
        if (r==0) XSUM_logVerbose(3,".\r");  /* do something with r to defeat compiler "optimizing" hash away */

        {   clock_t const nbTicks = XSUM_clockSpan(cStart);
            double const ticksPerHash = ((double)nbTicks / TIMELOOP) / nbh_perIteration;
            /*
             * clock() is the only decent portable timer, but it isn't very
             * precise.
             *
             * Sometimes, this lack of precision is enough that the benchmark
             * finishes before there are enough ticks to get a meaningful result.
             *
             * For example, on a Core 2 Duo (without any sort of Turbo Boost),
             * the imprecise timer caused peculiar results like so:
             *
             *    XXH3_64b                   4800.0 MB/s // conveniently even
             *    XXH3_64b unaligned         4800.0 MB/s
             *    XXH3_64b seeded            9600.0 MB/s // magical 2x speedup?!
             *    XXH3_64b seeded unaligned  4800.0 MB/s
             *
             * If we sense a suspiciously low number of ticks, we increase the
             * iterations until we can get something meaningful.
             */
            if (nbTicks < TIMELOOP_MIN) {
                /* Not enough time spent in benchmarking, risk of rounding bias */
                if (nbTicks == 0) { /* faster than resolution timer */
                    nbh_perIteration *= 100;
                } else {
                    /*
                     * update nbh_perIteration so that the next round lasts
                     * approximately 1 second.
                     */
                    double nbh_perSecond = (1 / ticksPerHash) + 1;
                    if (nbh_perSecond > (double)(4000U<<20)) nbh_perSecond = (double)(4000U<<20);   /* avoid overflow */
                    nbh_perIteration = (XSUM_U32)nbh_perSecond;
                }
                /* g_nbIterations==0 => quick evaluation, no claim of accuracy */
                if (g_nbIterations>0) {
                    iterationNb--;   /* new round for a more accurate speed evaluation */
                    continue;
                }
            }
            if (ticksPerHash < fastestH) fastestH = ticksPerHash;
            if (fastestH>0.) { /* avoid div by zero */
                XSUM_logVerbose(2, "%2u-%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \r",
                            iterationNb,
                            HASHNAME_MAX, HASHNAME_MAX, hName,
                            (unsigned)bufferSize,
                            (double)1 / fastestH,
                            ((double)bufferSize / (1 MB)) / fastestH);
        }   }
        {   double nbh_perSecond = (1 / fastestH) + 1;
            if (nbh_perSecond > (double)(4000U<<20)) nbh_perSecond = (double)(4000U<<20);   /* avoid overflow */
            nbh_perIteration = (XSUM_U32)nbh_perSecond;
        }
    }
    XSUM_logVerbose(1, "%2i#%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \n",
                    testID,
                    HASHNAME_MAX, HASHNAME_MAX, hName,
                    (unsigned)bufferSize,
                    (double)1 / fastestH,
                    ((double)bufferSize / (1 MB)) / fastestH);
    if (XSUM_logLevel<1)
        XSUM_logVerbose(0, "%u, ", (unsigned)((double)1 / fastestH));
}